

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_load.c
# Opt level: O3

void LoadExtByName(char *extensionName)

{
  code *pcVar1;
  int iVar2;
  long lVar3;
  
  lVar3 = 0x10;
  do {
    iVar2 = strcmp(extensionName,*(char **)((long)&PTR_typeinfo_0086b550 + lVar3));
    if (iVar2 == 0) {
      pcVar1 = *(code **)((long)&ExtensionMap[0].extensionName + lVar3);
      if (pcVar1 == (code *)0x0) {
        iVar2 = 1;
      }
      else {
        iVar2 = (*pcVar1)();
        iVar2 = iVar2 + 1;
      }
      **(int **)(&UNK_0086b558 + lVar3) = iVar2;
      return;
    }
    lVar3 = lVar3 + 0x18;
  } while ((int)lVar3 != 0x118);
  return;
}

Assistant:

static void LoadExtByName(const char *extensionName)
{
	ogl_StrToExtMap *entry = NULL;
	entry = FindExtEntry(extensionName);
	if(entry)
	{
		if(entry->LoadExtension)
		{
			int numFailed = entry->LoadExtension();
			if(numFailed == 0)
			{
				*(entry->extensionVariable) = ogl_LOAD_SUCCEEDED;
			}
			else
			{
				*(entry->extensionVariable) = ogl_LOAD_SUCCEEDED + numFailed;
			}
		}
		else
		{
			*(entry->extensionVariable) = ogl_LOAD_SUCCEEDED;
		}
	}
}